

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O2

bool woff2::TransformHmtxTable(Font *font)

{
  ulong uVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  pointer puVar2;
  size_t sVar3;
  pointer psVar4;
  pointer puVar5;
  ulong uVar6;
  bool bVar7;
  undefined1 uVar8;
  uint uVar9;
  Table *pTVar10;
  Table *pTVar11;
  Table *pTVar12;
  mapped_type *pmVar13;
  ushort uVar14;
  ushort uVar15;
  size_type __n;
  bool bVar16;
  uint uVar17;
  pointer puVar18;
  short *psVar19;
  int16_t lsb;
  uint local_130;
  uint local_12c;
  uint16_t advance_width;
  uint local_124;
  ulong local_120;
  ulong local_118;
  size_t glyph_size;
  uint local_104;
  uint8_t *local_100;
  vector<short,_std::allocator<short>_> monospace_lsbs;
  vector<short,_std::allocator<short>_> proportional_lsbs;
  vector<unsigned_short,_std::allocator<unsigned_short>_> advance_widths;
  uint8_t *glyph_data;
  Buffer hhea_buf;
  uint8_t flags;
  undefined3 uStack_6f;
  uint16_t local_68;
  vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
  local_58;
  uint32_t local_38;
  
  pTVar10 = Font::FindTable(font,0x676c7966);
  pTVar11 = Font::FindTable(font,0x686d7478);
  pTVar12 = Font::FindTable(font,0x68686561);
  bVar16 = true;
  bVar7 = true;
  if (pTVar10 != (Table *)0x0 && pTVar11 != (Table *)0x0) {
    if (pTVar12 != (Table *)0x0) {
      hhea_buf.buffer_ = pTVar12->data;
      hhea_buf.length_ = (size_t)pTVar12->length;
      hhea_buf.offset_ = 0;
      bVar7 = Buffer::Skip(&hhea_buf,0x22);
      if ((bVar7) && (hhea_buf.offset_ + 2 <= hhea_buf.length_)) {
        uVar14 = *(ushort *)(hhea_buf.buffer_ + hhea_buf.offset_);
        uVar17 = 0;
        if (uVar14 != 0) {
          uVar14 = uVar14 << 8 | uVar14 >> 8;
          hhea_buf.offset_ = hhea_buf.offset_ + 2;
          uVar9 = NumGlyphs(font);
          advance_widths.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          advance_widths.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
          advance_widths.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x0;
          proportional_lsbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          proportional_lsbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          proportional_lsbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          monospace_lsbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          monospace_lsbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          monospace_lsbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_104 = (uint)uVar14;
          local_12c = CONCAT31((int3)(uVar9 >> 8),(int)(uint)uVar14 < (int)uVar9);
          local_100 = pTVar11->data;
          local_118 = (ulong)pTVar11->length;
          if ((int)uVar9 < 1) {
            uVar9 = uVar17;
          }
          local_130 = (uint)CONCAT71((uint7)(uint3)(pTVar11->length >> 8),1);
          local_120 = 0;
          local_124 = uVar9;
          while (uVar9 != uVar17) {
            local_68 = 0;
            local_58.
            super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_58.
            super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_58.
            super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_38 = 0;
            bVar7 = GetGlyphData(font,uVar17,&glyph_data,&glyph_size);
            if ((bVar7) &&
               ((glyph_size == 0 ||
                (bVar7 = ReadGlyph(glyph_data,glyph_size,(Glyph *)&flags), bVar7)))) {
              sVar3 = glyph_size;
              advance_width = 0;
              lsb = 0;
              uVar1 = local_120 + 2;
              uVar14 = _flags;
              uVar6 = local_120;
              if (uVar17 < local_104) {
                if (uVar1 <= local_118) {
                  advance_width =
                       *(ushort *)(local_100 + local_120) << 8 |
                       *(ushort *)(local_100 + local_120) >> 8;
                  local_120 = local_120 + 4;
                  uVar6 = uVar1;
                  if (local_120 <= local_118) {
                    uVar15 = *(ushort *)(local_100 + uVar1) << 8 |
                             *(ushort *)(local_100 + uVar1) >> 8;
                    lsb = uVar15;
                    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                              (&advance_widths,&advance_width);
                    uVar9 = local_130 & 0xff;
                    local_130 = 0;
                    if (uVar14 == uVar15) {
                      local_130 = uVar9;
                    }
                    if (sVar3 == 0) {
                      local_130 = uVar9;
                    }
                    std::vector<short,_std::allocator<short>_>::push_back(&proportional_lsbs,&lsb);
                    goto LAB_0010e3b0;
                  }
                }
              }
              else if (uVar1 <= local_118) {
                lsb = *(ushort *)(local_100 + local_120) << 8 |
                      *(ushort *)(local_100 + local_120) >> 8;
                uVar9 = local_12c & 0xff;
                local_12c = 0;
                if (_flags == lsb) {
                  local_12c = uVar9;
                }
                if (glyph_size == 0) {
                  local_12c = uVar9;
                }
                std::vector<short,_std::allocator<short>_>::push_back(&monospace_lsbs,&lsb);
                local_120 = uVar1;
LAB_0010e3b0:
                uVar9 = local_124;
                if (((local_130 & 1) == 0) && ((local_12c & 1) == 0)) {
                  bVar16 = true;
                  bVar7 = false;
                }
                else {
                  bVar7 = true;
                }
                goto LAB_0010e3cd;
              }
              local_120 = uVar6;
              bVar7 = false;
              bVar16 = false;
              uVar9 = local_124;
            }
            else {
              bVar7 = false;
              bVar16 = false;
            }
LAB_0010e3cd:
            std::
            vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
            ::~vector(&local_58);
            uVar17 = uVar17 + 1;
            if (!bVar7) goto LAB_0010e4e4;
          }
          _flags = 0xe8edf4f8;
          pmVar13 = std::
                    map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                    ::operator[](&font->tables,(key_type *)&flags);
          uVar17 = _flags;
          _flags = _flags & 0xffffff00;
          __n = (long)advance_widths.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_finish +
                (1 - (long)advance_widths.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start);
          if ((local_130 & 1) == 0) {
            __n = (long)proportional_lsbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                        super__Vector_impl_data._M_finish +
                  (__n - (long)proportional_lsbs.super__Vector_base<short,_std::allocator<short>_>.
                               _M_impl.super__Vector_impl_data._M_start);
            uVar8 = 2;
          }
          else {
            uStack_6f = SUB43(uVar17,1);
            _flags = CONCAT31(uStack_6f,1);
            uVar8 = 3;
          }
          if ((local_12c & 1) == 0) {
            __n = (long)monospace_lsbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                        super__Vector_impl_data._M_finish +
                  (__n - (long)monospace_lsbs.super__Vector_base<short,_std::allocator<short>_>.
                               _M_impl.super__Vector_impl_data._M_start);
          }
          else {
            _flags = CONCAT31(uStack_6f,uVar8);
          }
          this = &pmVar13->buffer;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(this,__n);
          anon_unknown_2::WriteBytes(this,&flags,1);
          puVar5 = advance_widths.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (puVar18 = advance_widths.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start;
              psVar4 = proportional_lsbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                       super__Vector_impl_data._M_finish, puVar18 != puVar5; puVar18 = puVar18 + 1)
          {
            anon_unknown_2::WriteUShort(this,(uint)*puVar18);
          }
          psVar19 = proportional_lsbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((local_130 & 1) == 0) {
            for (; psVar19 != psVar4; psVar19 = psVar19 + 1) {
              anon_unknown_2::WriteUShort(this,(int)*psVar19);
            }
          }
          psVar4 = monospace_lsbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          psVar19 = monospace_lsbs.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((local_12c & 1) == 0) {
            for (; psVar19 != psVar4; psVar19 = psVar19 + 1) {
              anon_unknown_2::WriteUShort(this,(int)*psVar19);
            }
          }
          pmVar13->tag = 0xe8edf4f8;
          pmVar13->flag_byte = '@';
          puVar2 = (pmVar13->buffer).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pmVar13->length =
               *(int *)&(pmVar13->buffer).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (int)puVar2;
          pmVar13->data = puVar2;
          bVar16 = true;
LAB_0010e4e4:
          std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
                    (&monospace_lsbs.super__Vector_base<short,_std::allocator<short>_>);
          std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
                    (&proportional_lsbs.super__Vector_base<short,_std::allocator<short>_>);
          std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                    (&advance_widths.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
          return bVar16;
        }
      }
    }
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool TransformHmtxTable(Font* font) {
  const Font::Table* glyf_table = font->FindTable(kGlyfTableTag);
  const Font::Table* hmtx_table = font->FindTable(kHmtxTableTag);
  const Font::Table* hhea_table = font->FindTable(kHheaTableTag);

  // If you don't have hmtx or a glyf not much is going to happen here
  if (hmtx_table == NULL || glyf_table == NULL) {
    return true;
  }

  // hmtx without hhea doesn't make sense
  if (hhea_table == NULL) {
    return FONT_COMPRESSION_FAILURE();
  }

  // Skip 34 to reach 'hhea' numberOfHMetrics
  Buffer hhea_buf(hhea_table->data, hhea_table->length);
  uint16_t num_hmetrics;
  if (!hhea_buf.Skip(34) || !hhea_buf.ReadU16(&num_hmetrics)) {
    return FONT_COMPRESSION_FAILURE();
  }

  // Must have at least one hMetric
  if (num_hmetrics < 1) {
    return FONT_COMPRESSION_FAILURE();
  }

  int num_glyphs = NumGlyphs(*font);

  // Most fonts can be transformed; assume it's a go until proven otherwise
  std::vector<uint16_t> advance_widths;
  std::vector<int16_t> proportional_lsbs;
  std::vector<int16_t> monospace_lsbs;

  bool remove_proportional_lsb = true;
  bool remove_monospace_lsb = (num_glyphs - num_hmetrics) > 0;

  Buffer hmtx_buf(hmtx_table->data, hmtx_table->length);
  for (int i = 0; i < num_glyphs; i++) {
    Glyph glyph;
    const uint8_t* glyph_data;
    size_t glyph_size;
    if (!GetGlyphData(*font, i, &glyph_data, &glyph_size) ||
        (glyph_size > 0 && !ReadGlyph(glyph_data, glyph_size, &glyph))) {
      return FONT_COMPRESSION_FAILURE();
    }

    uint16_t advance_width = 0;
    int16_t lsb = 0;

    if (i < num_hmetrics) {
      // [0, num_hmetrics) are proportional hMetrics
      if (!hmtx_buf.ReadU16(&advance_width)) {
        return FONT_COMPRESSION_FAILURE();
      }

      if (!hmtx_buf.ReadS16(&lsb)) {
        return FONT_COMPRESSION_FAILURE();
      }

      if (glyph_size > 0 && glyph.x_min != lsb) {
        remove_proportional_lsb = false;
      }

      advance_widths.push_back(advance_width);
      proportional_lsbs.push_back(lsb);
    } else {
      // [num_hmetrics, num_glyphs) are monospace leftSideBearing's
      if (!hmtx_buf.ReadS16(&lsb)) {
        return FONT_COMPRESSION_FAILURE();
      }
      if (glyph_size > 0 && glyph.x_min != lsb) {
        remove_monospace_lsb = false;
      }
      monospace_lsbs.push_back(lsb);
    }

    // If we know we can't optimize, bail out completely
    if (!remove_proportional_lsb && !remove_monospace_lsb) {
      return true;
    }
  }

  Font::Table* transformed_hmtx = &font->tables[kHmtxTableTag ^ 0x80808080];

  uint8_t flags = 0;
  size_t transformed_size = 1 + 2 * advance_widths.size();
  if (remove_proportional_lsb) {
    flags |= 1;
  } else {
    transformed_size += 2 * proportional_lsbs.size();
  }
  if (remove_monospace_lsb) {
    flags |= 1 << 1;
  } else {
    transformed_size += 2 * monospace_lsbs.size();
  }

  transformed_hmtx->buffer.reserve(transformed_size);
  std::vector<uint8_t>* out = &transformed_hmtx->buffer;
  WriteBytes(out, &flags, 1);
  for (uint16_t advance_width : advance_widths) {
    WriteUShort(out, advance_width);
  }

  if (!remove_proportional_lsb) {
    for (int16_t lsb : proportional_lsbs) {
      WriteUShort(out, lsb);
    }
  }
  if (!remove_monospace_lsb) {
    for (int16_t lsb : monospace_lsbs) {
      WriteUShort(out, lsb);
    }
  }

  transformed_hmtx->tag = kHmtxTableTag ^ 0x80808080;
  transformed_hmtx->flag_byte = 1 << 6;
  transformed_hmtx->length = transformed_hmtx->buffer.size();
  transformed_hmtx->data = transformed_hmtx->buffer.data();


  return true;
}